

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O1

void __thiscall wallet::CKeyMetadata::CKeyMetadata(CKeyMetadata *this)

{
  long lVar1;
  uint160 *puVar2;
  base_blob<160U> *pbVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->hdKeypath)._M_dataplus._M_p = (pointer)&(this->hdKeypath).field_2;
  (this->hdKeypath)._M_string_length = 0;
  (this->hdKeypath).field_2._M_local_buf[0] = '\0';
  puVar2 = &(this->hd_seed_id).super_uint160;
  (puVar2->super_base_blob<160U>).m_data._M_elems[0] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[1] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[2] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[3] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[4] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[5] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[6] = '\0';
  (puVar2->super_base_blob<160U>).m_data._M_elems[7] = '\0';
  pbVar3 = &(this->hd_seed_id).super_uint160.super_base_blob<160U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
  pbVar3 = &(this->hd_seed_id).super_uint160.super_base_blob<160U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  SetNull(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CKeyMetadata()
    {
        SetNull();
    }